

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printArithExtend(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  AArch64_AM_ShiftExtendType ST;
  uint val;
  uint uVar2;
  uint uVar3;
  MCOperand *pMVar4;
  int64_t iVar5;
  char *pcVar6;
  arm64_extender ext;
  uint Src1;
  uint Dest;
  uint ShiftVal;
  AArch64_AM_ShiftExtendType ExtType;
  uint Val;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  pMVar4 = MCInst_getOperand(MI,OpNum);
  iVar5 = MCOperand_getImm(pMVar4);
  ST = AArch64_AM_getArithExtendType((uint)iVar5);
  val = AArch64_AM_getArithShiftValue((uint)iVar5);
  if ((ST == AArch64_AM_UXTW) || (ST == AArch64_AM_UXTX)) {
    pMVar4 = MCInst_getOperand(MI,0);
    uVar2 = MCOperand_getReg(pMVar4);
    pMVar4 = MCInst_getOperand(MI,1);
    uVar3 = MCOperand_getReg(pMVar4);
    if ((((uVar2 == 4) || (uVar3 == 4)) && (ST == AArch64_AM_UXTX)) ||
       (((uVar2 == 5 || (uVar3 == 5)) && (ST == AArch64_AM_UXTW)))) {
      if (val == 0) {
        return;
      }
      SStream_concat0(O,", lsl ");
      printInt32Bang(O,val);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      puVar1 = MI->flat_insn->detail->groups +
               (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x22;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(MI->flat_insn->detail->groups +
               (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x26) = val;
      return;
    }
  }
  pcVar6 = AArch64_AM_getShiftExtendName(ST);
  SStream_concat(O,", %s",pcVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    switch(ST) {
    default:
      break;
    case AArch64_AM_UXTH:
      break;
    case AArch64_AM_UXTW:
      break;
    case AArch64_AM_UXTX:
      break;
    case AArch64_AM_SXTB:
      break;
    case AArch64_AM_SXTH:
      break;
    case AArch64_AM_SXTW:
      break;
    case AArch64_AM_SXTX:
    }
    puVar1 = MI->flat_insn->detail->groups +
             (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x2a;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  if (val != 0) {
    SStream_concat0(O," ");
    printInt32Bang(O,val);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x22;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(MI->flat_insn->detail->groups +
               (long)(int)((MI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x30 + 0x26) = val;
    }
  }
  return;
}

Assistant:

static void printArithExtend(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	AArch64_AM_ShiftExtendType ExtType = AArch64_AM_getArithExtendType(Val);
	unsigned ShiftVal = AArch64_AM_getArithShiftValue(Val);

	// If the destination or first source register operand is [W]SP, print
	// UXTW/UXTX as LSL, and if the shift amount is also zero, print nothing at
	// all.
	if (ExtType == AArch64_AM_UXTW || ExtType == AArch64_AM_UXTX) {
		unsigned Dest = MCOperand_getReg(MCInst_getOperand(MI, 0));
		unsigned Src1 = MCOperand_getReg(MCInst_getOperand(MI, 1));
		if ( ((Dest == AArch64_SP || Src1 == AArch64_SP) &&
					ExtType == AArch64_AM_UXTX) ||
				((Dest == AArch64_WSP || Src1 == AArch64_WSP) &&
				 ExtType == AArch64_AM_UXTW) ) {
			if (ShiftVal != 0) {
				SStream_concat0(O, ", lsl ");
				printInt32Bang(O, ShiftVal);
				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
				}
			}

			return;
		}
	}

	SStream_concat(O, ", %s", AArch64_AM_getShiftExtendName(ExtType));
	if (MI->csh->detail) {
		arm64_extender ext = ARM64_EXT_INVALID;
		switch(ExtType) {
			default:	// never reach
			case AArch64_AM_UXTB:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTH:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTX:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTB:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTH:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTX:
				ext = ARM64_EXT_UXTW;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].ext = ext;
	}

	if (ShiftVal != 0) {
		SStream_concat0(O, " ");
		printInt32Bang(O, ShiftVal);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
		}
	}
}